

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStream::QTextStream(QTextStream *this,QIODevice *device)

{
  QDeviceClosedNotifier *this_00;
  QTextStreamPrivate *pQVar1;
  QIODevice *in_RSI;
  QTextStream *in_RDI;
  QTextStream *in_stack_00000008;
  QTextStreamPrivate *in_stack_00000010;
  QTextStreamPrivate *d;
  pointer in_stack_ffffffffffffffb8;
  unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *device_00;
  
  in_RDI->_vptr_QTextStream = (_func_int **)&PTR__QTextStream_00be7f68;
  device_00 = &in_RDI->d_ptr;
  this_00 = (QDeviceClosedNotifier *)operator_new(0x168);
  QTextStreamPrivate::QTextStreamPrivate(in_stack_00000010,in_stack_00000008);
  std::unique_ptr<QTextStreamPrivate,std::default_delete<QTextStreamPrivate>>::
  unique_ptr<std::default_delete<QTextStreamPrivate>,void>(device_00,in_stack_ffffffffffffffb8);
  pQVar1 = d_func((QTextStream *)0x4a754d);
  pQVar1->device = in_RSI;
  QDeviceClosedNotifier::setupDevice(this_00,in_RDI,(QIODevice *)device_00);
  pQVar1->status = Ok;
  return;
}

Assistant:

QTextStream::QTextStream(QIODevice *device)
    : d_ptr(new QTextStreamPrivate(this))
{
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStream::QTextStream(QIODevice *device == *%p)",
           device);
#endif
    Q_D(QTextStream);
    d->device = device;
#ifndef QT_NO_QOBJECT
    d->deviceClosedNotifier.setupDevice(this, d->device);
#endif
    d->status = Ok;
}